

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotHLines<unsigned_int>(char *label_id,uint *ys,int count,int offset,int stride)

{
  int iVar1;
  uint uVar2;
  ImPlotPlot *pIVar3;
  undefined1 auVar4 [16];
  double dVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  ImPlotRange *pIVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  ImU32 col;
  ImDrawList *DrawList;
  int i;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  ImPlotLimits lims;
  TransformerLinLin local_8c;
  GetterXRefYs<unsigned_int> local_88;
  GetterXRefYs<unsigned_int> local_68;
  ImPlotLimits local_48;
  
  bVar11 = BeginItem(label_id,0);
  if (bVar11) {
    GetPlotLimits(&local_48,-1);
    pIVar10 = GImPlot;
    local_68.XRef = local_48.X.Min;
    if (count == 0) {
      local_88.Offset = 0;
    }
    else {
      local_88.Offset = (offset % count + count) % count;
    }
    local_88.XRef = local_48.X.Max;
    if ((0 < count) && (GImPlot->FitThisFrame != false)) {
      pIVar3 = GImPlot->CurrentPlot;
      iVar1 = pIVar3->CurrentYAxis;
      pIVar9 = GImPlot->ExtentsY;
      iVar12 = 0;
      do {
        uVar2 = *(uint *)((long)ys +
                         (long)(((local_88.Offset + iVar12) % count + count) % count) * (long)stride
                         );
        if ((uVar2 != 0) || ((pIVar3->YAxis[iVar1].Flags & 0x20U) == 0)) {
          dVar5 = (double)uVar2;
          dVar7 = pIVar9[iVar1].Min;
          dVar8 = pIVar10->ExtentsY[iVar1].Max;
          uVar13 = -(ulong)((double)uVar2 < dVar7);
          uVar14 = -(ulong)(dVar8 < dVar5);
          uVar6 = (ulong)dVar5 & uVar14;
          auVar15._0_8_ = ~uVar13 & (ulong)dVar7;
          auVar15._8_8_ = ~uVar14 & (ulong)dVar8;
          auVar4._8_4_ = (int)uVar6;
          auVar4._0_8_ = (ulong)dVar5 & uVar13;
          auVar4._12_4_ = (int)(uVar6 >> 0x20);
          pIVar9[iVar1] = (ImPlotRange)(auVar15 | auVar4);
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
    local_88.Ys = ys;
    local_88.Count = count;
    local_88.Stride = stride;
    local_68.Ys = ys;
    local_68.Count = count;
    local_68.Offset = local_88.Offset;
    local_68.Stride = stride;
    DrawList = GetPlotDrawList();
    if ((pIVar10->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
      iVar1 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar1]) {
      case 0:
        local_8c.YAxis = iVar1;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLinLin>
                  (&local_68,&local_88,&local_8c,DrawList,(pIVar10->NextItemData).LineWeight,col);
        break;
      case 1:
        local_8c.YAxis = iVar1;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLogLin>
                  (&local_68,&local_88,(TransformerLogLin *)&local_8c,DrawList,
                   (pIVar10->NextItemData).LineWeight,col);
        break;
      case 2:
        local_8c.YAxis = iVar1;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLinLog>
                  (&local_68,&local_88,(TransformerLinLog *)&local_8c,DrawList,
                   (pIVar10->NextItemData).LineWeight,col);
        break;
      case 3:
        local_8c.YAxis = iVar1;
        RenderLineSegments<ImPlot::GetterXRefYs<unsigned_int>,ImPlot::GetterXRefYs<unsigned_int>,ImPlot::TransformerLogLog>
                  (&local_68,&local_88,(TransformerLogLog *)&local_8c,DrawList,
                   (pIVar10->NextItemData).LineWeight,col);
      }
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotHLines(const char* label_id, const T* ys, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXRefYs<T> get_min(lims.X.Min,ys,count,offset,stride);
        GetterXRefYs<T> get_max(lims.X.Max,ys,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointY(get_min(i).y);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}